

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> __thiscall
cppforth::Forth::GetFileHandle(Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  Forth *this_00;
  errorCodes in_R8D;
  pointer pFVar5;
  element_type *unaff_R15;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> sVar6;
  
  this_00 = (Forth *)CONCAT44(in_register_00000034,handler);
  pFVar1 = (this_00->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar5 = (this_00->OpenFiles).
                super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar1; pFVar5 = pFVar5 + 1) {
    if (pFVar5->FILE == (Cell)function) {
      unaff_R15 = (pFVar5->fileObject).
                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      cVar3 = std::__basic_file<char>::is_open();
      _Var4._M_pi = extraout_RDX;
      if (cVar3 != '\0') goto LAB_0011d7dc;
    }
  }
  this = (Forth *)&stack0xffffffffffffffb0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_0000000c,ec),": wrong file handler access");
  throwMessage(this_00,(string *)this,in_R8D);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  __cxa_rethrow();
  _Var4._M_pi = extraout_RDX_00;
LAB_0011d7dc:
  *(element_type **)this = unaff_R15;
  p_Var2 = (pFVar5->fileObject).
           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->False = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sVar6.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  sVar6.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>)
         sVar6.
         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<std::fstream> GetFileHandle(Cell handler, const std::string &function, errorCodes ec=errorAbort){
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it){
		if ((*it).FILE == handler && (*it).fileObject->is_open()){
			return (*it).fileObject;
		}
	}
	throwMessage(function + ": wrong file handler access",ec);
	throw;
}